

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O3

block_t * __thiscall
plot::detail::braille::block_t::paint
          (block_t *__return_storage_ptr__,block_t *this,block_t *dst,TerminalOp op)

{
  undefined3 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  if (this->pixels == '\0') {
LAB_0010588a:
    uVar1 = *(undefined3 *)&dst->field_0x11;
    __return_storage_ptr__->pixels = dst->pixels;
    *(undefined3 *)&__return_storage_ptr__->field_0x11 = uVar1;
    fVar2 = (dst->color).r;
    fVar3 = (dst->color).g;
    fVar4 = (dst->color).b;
    fVar5 = (dst->color).a;
  }
  else {
    if (op == ClipSrc) {
      if (dst->pixels != '\0') goto LAB_0010588a;
    }
    else if (op != ClipDst) {
      if (op == Over) {
        over(__return_storage_ptr__,this,dst);
        return __return_storage_ptr__;
      }
      goto LAB_0010588a;
    }
    uVar1 = *(undefined3 *)&this->field_0x11;
    __return_storage_ptr__->pixels = this->pixels;
    *(undefined3 *)&__return_storage_ptr__->field_0x11 = uVar1;
    fVar2 = (this->color).r;
    fVar3 = (this->color).g;
    fVar4 = (this->color).b;
    fVar5 = (this->color).a;
  }
  (__return_storage_ptr__->color).r = fVar2;
  (__return_storage_ptr__->color).g = fVar3;
  (__return_storage_ptr__->color).b = fVar4;
  (__return_storage_ptr__->color).a = fVar5;
  return __return_storage_ptr__;
}

Assistant:

block_t paint(block_t const& dst, TerminalOp op) const {
            if (pixels) {
                switch (op) {
                    case TerminalOp::Over:
                        return over(dst);
                    case TerminalOp::ClipDst:
                        return *this;
                    case TerminalOp::ClipSrc:
                        if (!dst.pixels)
                            return *this;
                }
            }

            return dst;
        }